

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O2

void logical_or_with_cancel_combine_accum_help(int x,int *accum)

{
  uint uVar1;
  
  if (x == 0x7ffffffe) {
    return;
  }
  if (x == 0x7fffffff) {
    uVar1 = 0x7fffffff;
    if (*accum != 0x7ffffffe) {
      return;
    }
  }
  else {
    uVar1 = *accum;
    if ((int)uVar1 < 0x7ffffffe) {
      if (x < 1) {
        if (-1 < x) {
          return;
        }
        uVar1 = uVar1 | 2;
      }
      else {
        uVar1 = uVar1 | 1;
      }
    }
    else {
      uVar1 = 1;
      if (x < 1) {
        uVar1 = (uint)(x != 0) * 2;
      }
    }
  }
  *accum = uVar1;
  return;
}

Assistant:

static void logical_or_with_cancel_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = (x > 0) ? 1 : ((x < 0) ? 2 : 0);
	} else if (x > 0) {
		*accum |= 1;
	} else if (x < 0) {
		*accum |= 2;
	}
}